

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O1

err_t BufWrite(bufstream *p,uint8_t *Data,size_t Size,size_t *Written)

{
  size_t sVar1;
  stream *psVar2;
  size_t sVar3;
  err_t eVar4;
  size_t sVar5;
  size_t local_40;
  size_t *local_38;
  
  if (Size == 0) {
    eVar4 = 0;
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    local_40 = Size;
    local_38 = Written;
    do {
      if ((0xfff < p->WritePos) && (eVar4 = BufFlush(p), Written = local_38, eVar4 != 0))
      goto LAB_001215a7;
      sVar1 = p->WritePos;
      if (0x1000 < local_40 && sVar1 == 0) {
        psVar2 = p->Stream;
        if (psVar2 == (stream *)0x0) {
          __assert_fail("(const void*)(p->Stream)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                        ,0x6a,"err_t BufWrite(bufstream *, const uint8_t *, size_t, size_t *)");
        }
        eVar4 = (**(code **)((long)(psVar2->Base).VMT + 0x70))
                          (psVar2,Data + sVar5,local_40,&local_40);
        sVar5 = sVar5 + local_40;
        Written = local_38;
        goto LAB_001215a7;
      }
      if (0x1000 - sVar1 < local_40) {
        local_40 = 0x1000 - sVar1;
      }
      sVar3 = local_40;
      memcpy(p->Buffer + sVar1,Data + sVar5,local_40);
      p->WritePos = p->WritePos + sVar3;
      sVar5 = sVar5 + sVar3;
      local_40 = Size - sVar5;
    } while (local_40 != 0);
    eVar4 = 0;
    Written = local_38;
  }
LAB_001215a7:
  if (Written != (size_t *)0x0) {
    *Written = sVar5;
  }
  return eVar4;
}

Assistant:

static err_t BufWrite(bufstream* p,const uint8_t* Data,size_t Size,size_t* Written)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->WritePos >= BUFSTREAM_SIZE && (Err = BufFlush(p)) != ERR_NONE)
            break;

        if (!p->WritePos && Left > BUFSTREAM_SIZE)
        {
            Err = Stream_Write(p->Stream,Data+Pos,Left,&Left);
            Pos += Left;
            break;
        }

        if (Left > BUFSTREAM_SIZE - p->WritePos)
            Left = BUFSTREAM_SIZE - p->WritePos;

        memcpy(p->Buffer+p->WritePos,Data+Pos,Left);
        Pos += Left;
        p->WritePos += Left;
    }

    if (Written)
        *Written = Pos;
    return Err;
}